

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotManager.cpp
# Opt level: O0

CK_RV __thiscall
SlotManager::getSlotList
          (SlotManager *this,ObjectStore *objectStore,CK_BBOOL tokenPresent,CK_SLOT_ID_PTR pSlotList
          ,CK_ULONG_PTR pulCount)

{
  bool bVar1;
  pointer ppVar2;
  Token *pTVar3;
  _func_int **pp_Var4;
  ObjectStore *in_RCX;
  char in_DL;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_> *in_RDI;
  ulong *in_R8;
  iterator i_1;
  size_t endIx;
  size_t startIx;
  iterator i;
  bool uninitialized;
  size_t size;
  map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  ObjectStore *in_stack_ffffffffffffff80;
  _Self local_78;
  _Self local_70;
  undefined1 *local_68;
  long local_60;
  _Base_ptr local_58;
  _Self local_50;
  _Self local_48;
  byte local_39;
  ObjectStoreToken *pToken;
  undefined7 in_stack_ffffffffffffffe0;
  CK_RV local_8;
  
  pToken = (ObjectStoreToken *)0x0;
  if (in_R8 == (ulong *)0x0) {
    local_8 = 7;
  }
  else {
    local_39 = 0;
    local_48._M_node =
         (_Base_ptr)
         std::
         map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
         ::begin(in_stack_ffffffffffffff68);
    while( true ) {
      local_50._M_node =
           (_Base_ptr)
           std::
           map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
           ::end(in_stack_ffffffffffffff68);
      bVar1 = std::operator!=(&local_48,&local_50);
      if (!bVar1) break;
      if (in_DL == '\0') {
LAB_001eacfc:
        pToken = (ObjectStoreToken *)((long)&pToken->_vptr_ObjectStoreToken + 1);
      }
      else {
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_> *)
                            0x1eaced);
        bVar1 = Slot::isTokenPresent(ppVar2->second);
        if (bVar1) goto LAB_001eacfc;
      }
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_> *)
                          0x1ead14);
      pTVar3 = Slot::getToken(ppVar2->second);
      if (pTVar3 != (Token *)0x0) {
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_> *)
                            0x1ead2d);
        pTVar3 = Slot::getToken(ppVar2->second);
        bVar1 = Token::isInitialized(pTVar3);
        if (!bVar1) {
          local_39 = 1;
        }
      }
      local_58 = (_Base_ptr)
                 std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_>::operator++
                           (in_RDI,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    }
    if (in_RCX == (ObjectStore *)0x0) {
      if ((local_39 & 1) == 0) {
        ObjectStore::getTokenCount(in_stack_ffffffffffffff80);
        insertToken((SlotManager *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),in_RCX,
                    (CK_SLOT_ID)in_R8,pToken);
        pToken = (ObjectStoreToken *)((long)&pToken->_vptr_ObjectStoreToken + 1);
      }
      *in_R8 = (ulong)pToken;
      local_8 = 0;
    }
    else if ((ObjectStoreToken *)*in_R8 < pToken) {
      *in_R8 = (ulong)pToken;
      local_8 = 0x150;
    }
    else {
      local_60 = 0;
      local_68 = (undefined1 *)((long)&pToken[-1]._vptr_ObjectStoreToken + 7);
      local_70._M_node =
           (_Base_ptr)
           std::
           map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
           ::begin(in_stack_ffffffffffffff68);
      while( true ) {
        local_78._M_node =
             (_Base_ptr)
             std::
             map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
             ::end(in_stack_ffffffffffffff68);
        bVar1 = std::operator!=(&local_70,&local_78);
        if (!bVar1) break;
        if (in_DL == '\x01') {
          ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_> *)
                              0x1eae6d);
          bVar1 = Slot::isTokenPresent(ppVar2->second);
          if (bVar1) goto LAB_001eae7f;
        }
        else {
LAB_001eae7f:
          ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_> *)
                              0x1eae89);
          bVar1 = Slot::isTokenPresent(ppVar2->second);
          if (bVar1) {
            ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_>::
                     operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_> *)
                                0x1eaea2);
            pTVar3 = Slot::getToken(ppVar2->second);
            bVar1 = Token::isInitialized(pTVar3);
            if (!bVar1) {
              ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_>::
                       operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_> *
                                  )0x1eaec1);
              pp_Var4 = (_func_int **)Slot::getSlotID(ppVar2->second);
              (&in_RCX->_vptr_ObjectStore)[(long)local_68] = pp_Var4;
              local_68 = local_68 + -1;
              goto LAB_001eaf1b;
            }
          }
          ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_> *)
                              0x1eaef3);
          pp_Var4 = (_func_int **)Slot::getSlotID(ppVar2->second);
          (&in_RCX->_vptr_ObjectStore)[local_60] = pp_Var4;
          local_60 = local_60 + 1;
        }
LAB_001eaf1b:
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_>::operator++
                  (in_RDI,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      }
      *in_R8 = (ulong)pToken;
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

CK_RV SlotManager::getSlotList(ObjectStore* objectStore, CK_BBOOL tokenPresent, CK_SLOT_ID_PTR pSlotList, CK_ULONG_PTR pulCount)
{
	size_t size( 0 );

	if (pulCount == NULL) return CKR_ARGUMENTS_BAD;

	// Calculate the size of the list
	bool uninitialized = false;
	for (SlotMap::iterator i = slots.begin(); i != slots.end(); i++)
	{
		if ((tokenPresent == CK_FALSE) || i->second->isTokenPresent())
		{
			size++;
		}

		if (i->second->getToken() != NULL && i->second->getToken()->isInitialized() == false)
		{
			uninitialized = true;
		}
	}

	// The user wants the size of the list
	if (pSlotList == NULL)
	{
		// Always have an uninitialized token
		if (uninitialized == false)
		{
			insertToken(objectStore, objectStore->getTokenCount(), NULL);
			size++;
		}

		*pulCount = size;

		return CKR_OK;
	}

	// Is the given buffer too small?
	if (*pulCount < size)
	{
		*pulCount = size;

		return CKR_BUFFER_TOO_SMALL;
	}

	size_t startIx( 0 );
	size_t endIx( size-1 );

	for (SlotMap::iterator i = slots.begin(); i != slots.end(); i++)
	{
		if ((tokenPresent == CK_TRUE) && !i->second->isTokenPresent())
		{// only show token if present on slot. But this slot has no token so we continue
			continue;
		}
		// put uninitialized last. After all initialized or slots without tokens.
		if ( i->second->isTokenPresent() && !i->second->getToken()->isInitialized() ) {
			pSlotList[endIx--] =  i->second->getSlotID();
		} else {
			pSlotList[startIx++] = i->second->getSlotID();
		}
	}
	assert(startIx==endIx+1);
	*pulCount = size;

	return CKR_OK;
}